

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O1

time util::parse_time(tm tm)

{
  time_t tVar1;
  
  tm.tm_wday = 0;
  tVar1 = timegm((tm *)&stack0x00000008);
  return tVar1;
}

Assistant:

time parse_time(std::tm tm) {
	
	tm.tm_isdst = 0;
	
	#if defined(_WIN32)
	
	// Windows
	
	SYSTEMTIME st;
	st.wYear         = WORD(tm.tm_year + 1900);
	st.wMonth        = WORD(tm.tm_mon + 1);
	st.wDay          = WORD(tm.tm_mday);
	st.wHour         = WORD(tm.tm_hour);
	st.wMinute       = WORD(tm.tm_min);
	st.wSecond       = WORD(tm.tm_sec);
	st.wMilliseconds = 0;
	
	FILETIME ft;
	if(!SystemTimeToFileTime(&st, &ft)) {
		return 0;
	}
	return from_filetime(ft);
	
	#elif INNOEXTRACT_HAVE_TIMEGM
	
	// GNU / BSD extension
	
	return timegm(&tm);
	
	#else
	
	// Standard, but not thread-safe - should be OK for our use though
	
	char * tz = getenv("TZ");
	
	set_timezone("UTC");
	
	time ret = std::mktime(&tm);
	
	set_timezone(tz);
	
	return ret;
	
	#endif
	
}